

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool __thiscall
sentencepiece::string_util::lexical_cast<bool>(string_util *this,string_view arg,bool *result)

{
  long *plVar1;
  int iVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  string lower_value;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,arg._M_len,this + arg._M_len);
  plVar1 = local_50;
  if (local_48 != 0) {
    lVar5 = 0;
    do {
      iVar2 = tolower((int)*(char *)((long)plVar1 + lVar5));
      *(char *)((long)plVar1 + lVar5) = (char)iVar2;
      lVar5 = lVar5 + 1;
    } while (local_48 != lVar5);
  }
  bVar6 = true;
  uVar4 = 0;
  do {
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      cVar3 = '\x01';
LAB_00211e85:
      *arg._M_str = cVar3;
      break;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      cVar3 = '\0';
      goto LAB_00211e85;
    }
    bVar6 = uVar4 < 4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return bVar6;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, bool *result) {
  const char *kTrue[] = {"1", "t", "true", "y", "yes"};
  const char *kFalse[] = {"0", "f", "false", "n", "no"};
  std::string lower_value = std::string(arg);
  std::transform(lower_value.begin(), lower_value.end(), lower_value.begin(),
                 ::tolower);
  for (size_t i = 0; i < 5; ++i) {
    if (lower_value == kTrue[i]) {
      *result = true;
      return true;
    } else if (lower_value == kFalse[i]) {
      *result = false;
      return true;
    }
  }

  return false;
}